

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::Clear(FieldOptions *this)

{
  uint uVar1;
  FeatureSet *this_00;
  FieldOptions_FeatureSupport *this_01;
  char *pcVar2;
  int line;
  LogMessageFatal local_20;
  
  internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  RepeatedField<int>::Clear(&(this->field_0)._impl_.targets_);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldOptions_EditionDefault>>
            (&(this->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
            (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this_00 = (this->field_0)._impl_.features_;
      if (this_00 == (FeatureSet *)0x0) {
        pcVar2 = "!value || _impl_.features_ != nullptr";
        line = 0x27b8;
        goto LAB_0020c710;
      }
      FeatureSet::Clear(this_00);
    }
    if ((uVar1 & 2) != 0) {
      this_01 = (this->field_0)._impl_.feature_support_;
      if (this_01 == (FieldOptions_FeatureSupport *)0x0) {
        pcVar2 = "!value || _impl_.feature_support_ != nullptr";
        line = 0x27bc;
LAB_0020c710:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,line,pcVar2 + 10);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      FieldOptions_FeatureSupport::Clear(this_01);
    }
  }
  if ((uVar1 & 0xfc) != 0) {
    (this->field_0)._impl_.jstype_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x70) = 0;
  }
  if ((uVar1 & 0x700) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x7c) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FieldOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldOptions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.targets_.Clear();
  _impl_.edition_defaults_.Clear();
  _impl_.uninterpreted_option_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.features_ != nullptr);
      _impl_.features_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.feature_support_ != nullptr);
      _impl_.feature_support_->Clear();
    }
  }
  if ((cached_has_bits & 0x000000fcu) != 0) {
    ::memset(&_impl_.ctype_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.jstype_) -
        reinterpret_cast<char*>(&_impl_.ctype_)) + sizeof(_impl_.jstype_));
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    ::memset(&_impl_.unverified_lazy_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.retention_) -
        reinterpret_cast<char*>(&_impl_.unverified_lazy_)) + sizeof(_impl_.retention_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}